

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O2

void If_CluCofactors(word *pF,int nVars,int iVar,word *pCof0,word *pCof1)

{
  undefined8 uVar1;
  byte bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  word *pwVar6;
  int iVar7;
  byte bVar8;
  ulong uVar9;
  uint uVar10;
  word *pwVar11;
  ulong uVar12;
  word *pwVar13;
  long lVar14;
  
  uVar10 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar10 = 1;
  }
  if (iVar < nVars) {
    if (iVar < 6) {
      uVar9 = 0;
      if ((int)uVar10 < 1) {
        uVar10 = 0;
      }
      for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
        uVar5 = Truth6[iVar];
        uVar12 = ~uVar5 & pF[uVar9];
        bVar2 = (byte)(1 << ((byte)iVar & 0x1f));
        pCof0[uVar9] = uVar12 << (bVar2 & 0x3f) | uVar12;
        uVar5 = uVar5 & pF[uVar9];
        pCof1[uVar9] = uVar5 >> (bVar2 & 0x3f) | uVar5;
      }
    }
    else {
      bVar8 = (byte)iVar - 6;
      bVar2 = bVar8 & 0x1f;
      uVar3 = 1 << bVar2;
      iVar7 = 2 << (bVar8 & 0x1f);
      iVar4 = 0 << bVar2;
      uVar9 = 0;
      if (0 < (int)uVar3) {
        uVar9 = (ulong)uVar3;
      }
      pwVar11 = pCof0 + (int)uVar3;
      pwVar6 = pF + (int)uVar3;
      pwVar13 = pCof1 + (int)uVar3;
      for (; iVar4 < (int)uVar10; iVar4 = iVar4 + iVar7) {
        for (lVar14 = 0; uVar9 * 8 != lVar14; lVar14 = lVar14 + 8) {
          uVar1 = *(undefined8 *)((long)pF + lVar14);
          *(undefined8 *)((long)pwVar11 + lVar14) = uVar1;
          *(undefined8 *)((long)pCof0 + lVar14) = uVar1;
          uVar1 = *(undefined8 *)((long)pwVar6 + lVar14);
          *(undefined8 *)((long)pwVar13 + lVar14) = uVar1;
          *(undefined8 *)((long)pCof1 + lVar14) = uVar1;
        }
        pCof1 = pCof1 + iVar7;
        pCof0 = pCof0 + iVar7;
        pF = pF + iVar7;
        pwVar11 = pwVar11 + iVar7;
        pwVar6 = pwVar6 + iVar7;
        pwVar13 = pwVar13 + iVar7;
      }
    }
    return;
  }
  __assert_fail("iVar < nVars",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDec16.c"
                ,0x3fa,"void If_CluCofactors(word *, int, int, word *, word *)");
}

Assistant:

void If_CluCofactors( word * pF, int nVars, int iVar, word * pCof0, word * pCof1 )
{
    int nWords = If_CluWordNum( nVars );
    assert( iVar < nVars );
    if ( iVar < 6 )
    {
        int i, Shift = (1 << iVar);
        for ( i = 0; i < nWords; i++ )
        {
            pCof0[i] = (pF[i] & ~Truth6[iVar]) | ((pF[i] & ~Truth6[iVar]) << Shift);
            pCof1[i] = (pF[i] &  Truth6[iVar]) | ((pF[i] &  Truth6[iVar]) >> Shift);
        }
    }
    else
    {
        int i, k, Step = (1 << (iVar - 6));
        for ( k = 0; k < nWords; k += 2*Step )
        {
            for ( i = 0; i < Step; i++ )
            {
                pCof0[i] = pCof0[Step+i] = pF[i];
                pCof1[i] = pCof1[Step+i] = pF[Step+i];
            }
            pF    += 2*Step;
            pCof0 += 2*Step;
            pCof1 += 2*Step;
        }
    }
}